

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

void duckdb_brotli::DecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  long *plVar4;
  uint *puVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  HuffmanCode *pHVar10;
  uint64_t uVar11;
  HuffmanCode *pHVar12;
  
  uVar3 = s->num_block_types[2];
  if (1 < uVar3) {
    pHVar10 = s->block_type_trees;
    uVar9 = (s->br).val_;
    uVar6 = (s->br).bit_pos_;
    if (uVar6 < 0x11) {
      plVar4 = (long *)(s->br).next_in;
      uVar9 = uVar9 | *plVar4 << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
    }
    pHVar10 = pHVar10 + (uVar9 & 0xff) + 0x4f0;
    bVar7 = pHVar10->bits;
    if (8 < bVar7) {
      uVar6 = uVar6 - 8;
      uVar9 = uVar9 >> 8;
      pHVar10 = pHVar10 + (*(ulong *)(kBrotliBitMask + (ulong)(bVar7 - 8) * 8) & uVar9) +
                          (ulong)pHVar10->value;
      bVar7 = pHVar10->bits;
    }
    pHVar12 = s->block_len_trees;
    uVar6 = uVar6 - bVar7;
    uVar9 = uVar9 >> (bVar7 & 0x3f);
    (s->br).bit_pos_ = uVar6;
    (s->br).val_ = uVar9;
    uVar1 = pHVar10->value;
    if (uVar6 < 0x11) {
      plVar4 = (long *)(s->br).next_in;
      uVar9 = uVar9 | *plVar4 << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
    }
    pHVar12 = pHVar12 + (uVar9 & 0xff) + 0x318;
    uVar8 = (ulong)pHVar12->bits;
    if (8 < uVar8) {
      uVar6 = uVar6 - 8;
      uVar9 = uVar9 >> 8;
      pHVar12 = pHVar12 + (*(ulong *)(kBrotliBitMask + (ulong)(pHVar12->bits - 8) * 8) & uVar9) +
                          (ulong)pHVar12->value;
      uVar8 = (ulong)pHVar12->bits;
    }
    uVar9 = uVar9 >> ((byte)uVar8 & 0x3f);
    uVar6 = uVar6 - uVar8;
    (s->br).bit_pos_ = uVar6;
    (s->br).val_ = uVar9;
    bVar7 = _kBrotliPrefixCodeRanges[(ulong)pHVar12->value * 4 + 2];
    uVar2 = *(ushort *)(_kBrotliPrefixCodeRanges + (ulong)pHVar12->value * 4);
    if (uVar6 < 0x21) {
      puVar5 = (uint *)(s->br).next_in;
      uVar9 = uVar9 | (ulong)*puVar5 << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 + 0x20;
      (s->br).next_in = (uint8_t *)(puVar5 + 1);
    }
    uVar8 = *(ulong *)(kBrotliBitMask + (ulong)bVar7 * 8);
    (s->br).bit_pos_ = uVar6 - bVar7;
    (s->br).val_ = uVar9 >> (bVar7 & 0x3f);
    s->block_length[2] = (uVar8 & uVar9) + (ulong)uVar2;
    if ((ulong)uVar1 == 0) {
      uVar11 = s->block_type_rb[4];
    }
    else if (uVar1 == 1) {
      uVar11 = s->block_type_rb[5] + 1;
    }
    else {
      uVar11 = (ulong)uVar1 - 2;
    }
    uVar9 = 0;
    if (uVar3 <= uVar11) {
      uVar9 = uVar3;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = uVar11 - uVar9;
    s->dist_context_map_slice = s->dist_context_map + (uVar11 - uVar9) * 4;
    s->dist_htree_index = (s->dist_context_map + (uVar11 - uVar9) * 4)[s->distance_context];
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}